

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.cpp
# Opt level: O0

string * random_string_abi_cxx11_(void)

{
  allocator<const_char_*> *this;
  initializer_list<const_char_*> __l;
  size_type sVar1;
  result_type_conflict __n;
  string *in_RDI;
  result_type_conflict rnd;
  uniform_int_distribution<unsigned_long> dist6;
  int i;
  char *pcStack_d0;
  char *local_c8;
  char *pcStack_c0;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  char *pcStack_a0;
  char *local_98;
  char *pcStack_90;
  char *local_88;
  char *pcStack_80;
  char *local_78;
  char *pcStack_70;
  char *local_68;
  char *pcStack_60;
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> allowed;
  allocator<char> local_12;
  byte local_11;
  string *buf;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"",&local_12);
  std::allocator<char>::~allocator(&local_12);
  local_68 = "9";
  pcStack_60 = "0";
  local_78 = "7";
  pcStack_70 = "8";
  local_88 = "5";
  pcStack_80 = "6";
  local_98 = "3";
  pcStack_90 = "4";
  local_a8 = "1";
  pcStack_a0 = "2";
  local_b8 = "e";
  pcStack_b0 = "f";
  local_c8 = "c";
  pcStack_c0 = "d";
  _i = "a";
  pcStack_d0 = "b";
  local_50 = (iterator)&i;
  local_48 = 0x10;
  this = (allocator<const_char_*> *)((long)&dist6._M_param._M_b + 7);
  std::allocator<const_char_*>::allocator(this);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_40,__l,this);
  std::allocator<const_char_*>::~allocator
            ((allocator<const_char_*> *)((long)&dist6._M_param._M_b + 7));
  for (dist6._M_param._M_b._0_4_ = 0; (int)dist6._M_param._M_b < 0x14;
      dist6._M_param._M_b._0_4_ = (int)dist6._M_param._M_b + 1) {
    sVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_40);
    std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
              ((uniform_int_distribution<unsigned_long> *)&rnd,0,sVar1 - 1);
    __n = std::uniform_int_distribution<unsigned_long>::operator()
                    ((uniform_int_distribution<unsigned_long> *)&rnd,&rng);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_40,__n);
    std::__cxx11::string::append((char *)in_RDI);
  }
  local_11 = 1;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_40);
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string random_string() {

    std::string buf = "";
    std::vector allowed = {"a", "b", "c", "d", "e", "f", "1", "2", "3", "4", "5", "6", "7", "8", "9", "0"};

    for (int i = 0; i < 20; ++i) {
        std::uniform_int_distribution<std::mt19937::result_type> dist6(0, allowed.size() - 1);
        auto rnd = dist6(rng);

        buf.append(allowed[rnd]);
    }

    return buf;
}